

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

String * __thiscall
kj::anon_unknown_123::LocalPeerIdentityImpl::toString
          (String *__return_storage_ptr__,LocalPeerIdentityImpl *this)

{
  char (*params) [6];
  uint *in_R8;
  char (*in_R9) [2];
  StringPtr SVar1;
  ArrayPtr<char> buffer;
  ArrayPtr<char> buffer_00;
  ArrayPtr<char> local_b8;
  ArrayPtr<const_char> local_a8;
  char (*local_98) [6];
  uint *u;
  uint *_u3252;
  StringPtr uidStr;
  char uidBuffer [16];
  char *local_60;
  int *local_58;
  char *local_50;
  int *p;
  int *_p3246;
  StringPtr pidStr;
  char pidBuffer [16];
  LocalPeerIdentityImpl *this_local;
  
  memset(&pidStr.content.size_,0,0x10);
  StringPtr::StringPtr((StringPtr *)&_p3246,(void *)0x0);
  params = (char (*) [6])kj::_::readMaybe<int>(&(this->creds).pid);
  if (params != (char (*) [6])0x0) {
    ArrayPtr<char>::ArrayPtr<16ul>
              ((ArrayPtr<char> *)(uidBuffer + 8),(char (*) [16])&pidStr.content.size_);
    buffer.size_ = (size_t)" pid:";
    buffer.ptr = local_60;
    SVar1 = strPreallocated<char_const(&)[6],int&>((kj *)uidBuffer._8_8_,buffer,params,(int *)in_R8)
    ;
    local_58 = (int *)SVar1.content.ptr;
    _p3246 = local_58;
    local_50 = (char *)SVar1.content.size_;
    pidStr.content.ptr = local_50;
  }
  memset(&uidStr.content.size_,0,0x10);
  StringPtr::StringPtr((StringPtr *)&_u3252,(void *)0x0);
  u = kj::_::readMaybe<unsigned_int>(&(this->creds).uid);
  if ((char (*) [6])u != (char (*) [6])0x0) {
    local_98 = (char (*) [6])u;
    ArrayPtr<char>::ArrayPtr<16ul>(&local_b8,(char (*) [16])&uidStr.content.size_);
    buffer_00.size_ = (size_t)" uid:";
    buffer_00.ptr = (char *)local_b8.size_;
    local_a8 = (ArrayPtr<const_char>)
               strPreallocated<char_const(&)[6],unsigned_int&>
                         ((kj *)local_b8.ptr,buffer_00,local_98,in_R8);
    _u3252 = (uint *)local_a8.ptr;
    uidStr.content.ptr = (char *)local_a8.size_;
  }
  str<char_const(&)[12],kj::StringPtr&,kj::StringPtr&,char_const(&)[2]>
            (__return_storage_ptr__,(kj *)"(local peer",(char (*) [12])&_p3246,(StringPtr *)&_u3252,
             (StringPtr *)0x9e430f,in_R9);
  return __return_storage_ptr__;
}

Assistant:

kj::String toString() override {
    char pidBuffer[16]{};
    kj::StringPtr pidStr = nullptr;
    KJ_IF_SOME(p, creds.pid) {
      pidStr = strPreallocated(pidBuffer, " pid:", p);
    }

    char uidBuffer[16]{};
    kj::StringPtr uidStr = nullptr;
    KJ_IF_SOME(u, creds.uid) {
      uidStr = strPreallocated(uidBuffer, " uid:", u);
    }

    return kj::str("(local peer", pidStr, uidStr, ")");
  }